

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall
nuraft::asio_rpc_client::handle_handshake
          (asio_rpc_client *this,ptr<req_msg> *req,rpc_handler *when_done,uint64_t send_timeout_ms,
          error_code *err)

{
  uint uVar1;
  uint uVar2;
  element_type *peVar3;
  pointer pcVar4;
  pointer pcVar5;
  int iVar6;
  undefined8 uVar7;
  undefined1 local_115;
  uint local_114;
  _Any_data *local_110;
  ptr<rpc_exception> except;
  ptr<resp_msg> resp;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  ptr<asio_rpc_client> self;
  string *local_a8;
  string local_a0 [3];
  char *local_38;
  
  local_110 = (_Any_data *)when_done;
  std::__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::asio_rpc_client,void>
            ((__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2> *)&self,
             (__weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<nuraft::asio_rpc_client>);
  if (err->_M_value == 0) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (3 < iVar6) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (local_a0,"handshake with %s:%s succeeded (as a client)",
                   (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_handshake",0x550,local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0[0]._M_dataplus._M_p != &local_a0[0].field_2) {
          operator_delete(local_a0[0]._M_dataplus._M_p);
        }
      }
    }
    LOCK();
    (this->ssl_ready_)._M_base._M_i = true;
    UNLOCK();
    (*(this->super_rpc_client)._vptr_rpc_client[2])(this,req,local_110,send_timeout_ms);
  }
  else {
    LOCK();
    (this->abandoned_)._M_base._M_i = true;
    UNLOCK();
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (1 < iVar6) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_114 = (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                    ->super_msg_base).dst_;
        pcVar4 = (this->host_)._M_dataplus._M_p;
        pcVar5 = (this->port_)._M_dataplus._M_p;
        uVar1 = err->_M_value;
        (**(code **)(*(long *)err->_M_cat + 0x20))(local_d8,err->_M_cat,uVar1);
        msg_if_given_abi_cxx11_
                  (local_a0,"failed SSL handshake with peer %d, %s:%s, error %d, %s",
                   (ulong)local_114,pcVar4,pcVar5,(ulong)uVar1,local_d8[0]);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_handshake",0x558,local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0[0]._M_dataplus._M_p != &local_a0[0].field_2) {
          operator_delete(local_a0[0]._M_dataplus._M_p);
        }
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0]);
        }
      }
    }
    resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_38 = "failed SSL handshake with peer %d, %s:%s, error %d, %s";
    uVar1 = (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_msg_base).dst_;
    pcVar4 = (this->host_)._M_dataplus._M_p;
    pcVar5 = (this->port_)._M_dataplus._M_p;
    uVar2 = err->_M_value;
    (**(code **)(*(long *)err->_M_cat + 0x20))(local_d8,err->_M_cat,(ulong)uVar2);
    snprintf((char *)local_a0,100,local_38,(ulong)uVar1,pcVar4,pcVar5,(ulong)uVar2,local_d8[0]);
    except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a8 = local_a0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::rpc_exception,std::allocator<nuraft::rpc_exception>,char_const*,std::shared_ptr<nuraft::req_msg>&>
              (&except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(rpc_exception **)&except,(allocator<nuraft::rpc_exception> *)&local_115
               ,(char **)&local_a8,req);
    if (local_d8[0] != local_c8) {
      operator_delete(local_d8[0]);
    }
    if (*(long *)(local_110 + 1) == 0) {
      uVar7 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0[0]._M_dataplus._M_p != &local_a0[0].field_2) {
        operator_delete(local_a0[0]._M_dataplus._M_p);
      }
      if (self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      _Unwind_Resume(uVar7);
    }
    (**(code **)((long)local_110 + 0x18))(local_110,&resp,&except);
    if (except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  if (self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void handle_handshake(ptr<req_msg>& req,
                          rpc_handler& when_done,
                          uint64_t send_timeout_ms,
                          const ERROR_CODE& err)
    {
        ptr<asio_rpc_client> self = this->shared_from_this();

        if (!err) {
            p_in( "handshake with %s:%s succeeded (as a client)",
                  host_.c_str(), port_.c_str() );
            ssl_ready_ = true;
            this->send(req, when_done, send_timeout_ms);

        } else {
            abandoned_ = true;
            p_er( "failed SSL handshake with peer %d, %s:%s, error %d, %s",
                  req->get_dst(), host_.c_str(), port_.c_str(), err.value(),
                  err.message().c_str() );

            // Immediately stop.
            ptr<resp_msg> resp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt("failed SSL handshake with peer %d, %s:%s, "
                            "error %d, %s")
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), err.value(), err.message().c_str() ),
                    req ) );
            when_done(resp, except);
        }
    }